

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getcoluk.c
# Opt level: O0

int fffi4uint(int *input,long ntodo,double scale,double zero,int nullcheck,int tnull,uint nullval,
             char *nullarray,int *anynull,uint *output,int *status)

{
  double dVar1;
  double dvalue;
  long ii;
  char *nullarray_local;
  uint nullval_local;
  int tnull_local;
  int nullcheck_local;
  double zero_local;
  double scale_local;
  long ntodo_local;
  int *input_local;
  
  if (nullcheck == 0) {
    if (((scale != 1.0) || (NAN(scale))) || ((zero != 2147483648.0 || (NAN(zero))))) {
      if ((((scale != 1.0) || (NAN(scale))) || (zero != 0.0)) || (NAN(zero))) {
        for (ii = 0; ii < ntodo; ii = ii + 1) {
          dVar1 = (double)input[ii] * scale + zero;
          if (-0.49 <= dVar1) {
            if (dVar1 <= 4294967295.49) {
              output[ii] = (uint)(long)dVar1;
            }
            else {
              *status = -0xb;
              output[ii] = 0xffffffff;
            }
          }
          else {
            *status = -0xb;
            output[ii] = 0;
          }
        }
      }
      else {
        for (ii = 0; ii < ntodo; ii = ii + 1) {
          if (input[ii] < 0) {
            *status = -0xb;
            output[ii] = 0;
          }
          else {
            output[ii] = input[ii];
          }
        }
      }
    }
    else {
      for (ii = 0; ii < ntodo; ii = ii + 1) {
        output[ii] = input[ii] ^ 0x80000000;
      }
    }
  }
  else if ((((scale != 1.0) || (NAN(scale))) || (zero != 2147483648.0)) || (NAN(zero))) {
    if (((scale != 1.0) || (NAN(scale))) || ((zero != 0.0 || (NAN(zero))))) {
      for (ii = 0; ii < ntodo; ii = ii + 1) {
        if (input[ii] == tnull) {
          *anynull = 1;
          if (nullcheck == 1) {
            output[ii] = nullval;
          }
          else {
            nullarray[ii] = '\x01';
          }
        }
        else {
          dVar1 = (double)input[ii] * scale + zero;
          if (-0.49 <= dVar1) {
            if (dVar1 <= 4294967295.49) {
              output[ii] = (uint)(long)dVar1;
            }
            else {
              *status = -0xb;
              output[ii] = 0xffffffff;
            }
          }
          else {
            *status = -0xb;
            output[ii] = 0;
          }
        }
      }
    }
    else {
      for (ii = 0; ii < ntodo; ii = ii + 1) {
        if (input[ii] == tnull) {
          *anynull = 1;
          if (nullcheck == 1) {
            output[ii] = nullval;
          }
          else {
            nullarray[ii] = '\x01';
          }
        }
        else if (input[ii] < 0) {
          *status = -0xb;
          output[ii] = 0;
        }
        else {
          output[ii] = input[ii];
        }
      }
    }
  }
  else {
    for (ii = 0; ii < ntodo; ii = ii + 1) {
      if (input[ii] == tnull) {
        *anynull = 1;
        if (nullcheck == 1) {
          output[ii] = nullval;
        }
        else {
          nullarray[ii] = '\x01';
        }
      }
      else {
        output[ii] = input[ii] ^ 0x80000000;
      }
    }
  }
  return *status;
}

Assistant:

int fffi4uint(INT32BIT *input,    /* I - array of values to be converted     */
            long ntodo,           /* I - number of elements in the array     */
            double scale,         /* I - FITS TSCALn or BSCALE value         */
            double zero,          /* I - FITS TZEROn or BZERO  value         */
            int nullcheck,        /* I - null checking code; 0 = don't check */
                                  /*     1:set null pixels = nullval         */
                                  /*     2: if null pixel, set nullarray = 1 */
            INT32BIT tnull,       /* I - value of FITS TNULLn keyword if any */
   unsigned int  nullval,         /* I - set null pixels, if nullcheck = 1   */
            char *nullarray,      /* I - bad pixel array, if nullcheck = 2   */
            int  *anynull,        /* O - set to 1 if any pixels are null     */
   unsigned int  *output,         /* O - array of converted pixels           */
            int *status)          /* IO - error status                       */
/*
  Copy input to output following reading of the input from a FITS file.
  Check for null values and do datatype conversion and scaling if required.
  The nullcheck code value determines how any null values in the input array
  are treated.  A null value is an input pixel that is equal to tnull.  If 
  nullcheck = 0, then no checking for nulls is performed and any null values
  will be transformed just like any other pixel.  If nullcheck = 1, then the
  output pixel will be set = nullval if the corresponding input pixel is null.
  If nullcheck = 2, then if the pixel is null then the corresponding value of
  nullarray will be set to 1; the value of nullarray for non-null pixels 
  will = 0.  The anynull parameter will be set = 1 if any of the returned
  pixels are null, otherwise anynull will be returned with a value = 0;
*/
{
    long ii;
    double dvalue;

    if (nullcheck == 0)     /* no null checking required */
    {
        if (scale == 1. && zero == 2147483648.)
        {       
           /* Instead of adding 2147483648, it is more efficient */
           /* to just flip the sign bit with the XOR operator */

            for (ii = 0; ii < ntodo; ii++)
               output[ii] =  ( *(unsigned int *) &input[ii] ) ^ 0x80000000;
        }
        else if (scale == 1. && zero == 0.)      /* no scaling */
        {       
            for (ii = 0; ii < ntodo; ii++)
            {
                if (input[ii] < 0)
                {
                    *status = OVERFLOW_ERR;
                    output[ii] = 0;
                }
                else
                    output[ii] = (unsigned int) input[ii]; /* copy to output */
            }
        }
        else             /* must scale the data */
        {
            for (ii = 0; ii < ntodo; ii++)
            {
                dvalue = input[ii] * scale + zero;

                if (dvalue < DUINT_MIN)
                {
                    *status = OVERFLOW_ERR;
                    output[ii] = 0;
                }
                else if (dvalue > DUINT_MAX)
                {
                    *status = OVERFLOW_ERR;
                    output[ii] = UINT_MAX;
                }
                else
                    output[ii] = (unsigned int) dvalue;
            }
        }
    }
    else        /* must check for null values */
    {
        if (scale == 1. && zero == 2147483648.) 
        {       
            for (ii = 0; ii < ntodo; ii++)
            {
                if (input[ii] == tnull)
                {
                    *anynull = 1;
                    if (nullcheck == 1)
                        output[ii] = nullval;
                    else
                        nullarray[ii] = 1;
                }
                else
                   output[ii] =  ( *(unsigned int *) &input[ii] ) ^ 0x80000000;
            }
        }
        else if (scale == 1. && zero == 0.)  /* no scaling */
        {       
            for (ii = 0; ii < ntodo; ii++)
            {
                if (input[ii] == tnull)
                {
                    *anynull = 1;
                    if (nullcheck == 1)
                        output[ii] = nullval;
                    else
                        nullarray[ii] = 1;
                }
                else if (input[ii] < 0)
                {
                    *status = OVERFLOW_ERR;
                    output[ii] = 0;
                }
                else
                    output[ii] = (unsigned int) input[ii];
            }
        }
        else                  /* must scale the data */
        {
            for (ii = 0; ii < ntodo; ii++)
            {
                if (input[ii] == tnull)
                {
                    *anynull = 1;
                    if (nullcheck == 1)
                        output[ii] = nullval;
                    else
                        nullarray[ii] = 1;
                }
                else
                {
                    dvalue = input[ii] * scale + zero;

                    if (dvalue < DUINT_MIN)
                    {
                        *status = OVERFLOW_ERR;
                        output[ii] = 0;
                    }
                    else if (dvalue > DUINT_MAX)
                    {
                        *status = OVERFLOW_ERR;
                        output[ii] = UINT_MAX;
                    }
                    else
                        output[ii] = (unsigned int) dvalue;
                }
            }
        }
    }
    return(*status);
}